

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::drawRandomPrimitives
               (RenderContext *renderCtx,deUint32 program,PrimitiveType primType,int numPrimitives,
               Random *rnd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLint GVar4;
  undefined4 extraout_var;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  GLfloat GVar14;
  allocator<char> local_10d;
  float local_10c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vertices;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  string local_a0;
  Vec2 range;
  IndexType local_78 [2];
  void *local_70;
  Functions *gl;
  
  iVar3 = (*renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  vertices.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = 0;
  if (primType < PRIMITIVETYPE_LAST) {
    uVar11 = *(uint *)(&DAT_018d1408 + (ulong)primType * 4);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&vertices,(long)(int)(uVar11 * numPrimitives));
  fVar13 = *(float *)(&DAT_018d1320 + (ulong)(primType == PRIMITIVETYPE_TRIANGLE) * 4);
  local_10c = *(float *)(&DAT_018d1328 + (ulong)(primType == PRIMITIVETYPE_TRIANGLE) * 4);
  for (uVar9 = 0;
      uVar9 < (ulong)((long)vertices.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    fVar12 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[0] = fVar12 * local_10c + fVar13;
    fVar12 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar9].m_data[1] = fVar12 * local_10c + fVar13;
  }
  iVar3 = 0;
  if (numPrimitives < 1) {
    numPrimitives = 0;
  }
  for (uVar9 = 0; uVar9 != (uint)numPrimitives; uVar9 = uVar9 + 1) {
    iVar5 = uVar11 * (int)uVar9;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      bVar1 = true;
      bVar2 = true;
      uVar7 = (ulong)uVar11;
      iVar8 = iVar3;
      while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
        bVar1 = (bool)(bVar1 & vertices.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[lVar6] <=
                               -0.9);
        bVar2 = (bool)(bVar2 & 0.9 <= vertices.
                                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[lVar6]
                      );
        iVar8 = iVar8 + 1;
      }
      if (bVar1 || bVar2) {
        *(ulong *)vertices.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data =
             *(ulong *)vertices.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data ^ 0x8000000080000000;
      }
    }
    iVar3 = iVar3 + uVar11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"a_position",&local_10d);
  glu::va::Float((VertexArrayBinding *)&range,&local_a0,2,
                 (int)((ulong)((long)vertices.
                                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)vertices.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),0,
                 (vertices.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&range);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_a0);
  (*gl->useProgram)(program);
  if (primType - PRIMITIVETYPE_POINT < 2) {
    getRange((anon_unknown_1 *)&range,gl,0x846d);
    if (primType == PRIMITIVETYPE_WIDE_POINT) {
      fVar13 = deRandom_getFloat(&rnd->m_rnd);
      fVar13 = fVar13 * 16.0 + 16.0;
      uVar11 = -(uint)(fVar13 <= range.m_data[1]);
      GVar14 = (GLfloat)(~uVar11 & (uint)range.m_data[1] | (uint)fVar13 & uVar11);
    }
    else {
      GVar14 = 1.0;
    }
    GVar4 = (*gl->getUniformLocation)(program,"u_pointSize");
    (*gl->uniform1f)(GVar4,GVar14);
  }
  else if (primType == PRIMITIVETYPE_WIDE_LINE) {
    getRange((anon_unknown_1 *)&range,gl,0x846e);
    fVar13 = deRandom_getFloat(&rnd->m_rnd);
    fVar13 = fVar13 * 16.0 + 16.0;
    uVar11 = -(uint)(fVar13 <= range.m_data[1]);
    (*gl->lineWidth)((GLfloat)(~uVar11 & (uint)range.m_data[1] | (uint)fVar13 & uVar11));
    lVar6 = (long)vertexArrays.
                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)vertexArrays.
                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    range.m_data[0] = 4.2039e-45;
    goto LAB_0138325c;
  }
  lVar6 = (long)vertexArrays.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexArrays.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (primType < PRIMITIVETYPE_LAST) {
    (*(code *)(&DAT_018d1330 + *(int *)(&DAT_018d1330 + (ulong)primType * 4)))();
    return;
  }
  range.m_data[0] = 1.12104e-44;
LAB_0138325c:
  range.m_data[1] =
       (float)((ulong)((long)vertices.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_78[0] = INDEXTYPE_LAST;
  local_70 = (void *)0x0;
  glu::draw(renderCtx,program,(int)(lVar6 / 0x50),
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)&range,(DrawUtilCallback *)0x0
           );
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&vertexArrays);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&vertices.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return;
}

Assistant:

static void drawRandomPrimitives (const glu::RenderContext& renderCtx, deUint32 program, PrimitiveType primType, int numPrimitives, de::Random* rnd)
{
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const float						minPointSize	= 16.0f;
	const float						maxPointSize	= 32.0f;
	const float						minLineWidth	= 16.0f;
	const float						maxLineWidth	= 32.0f;
	vector<Vec2>					vertices;
	vector<glu::VertexArrayBinding>	vertexArrays;

	genVertices(primType, numPrimitives, rnd, &vertices);

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)vertices.size(), 0, (const float*)&vertices[0]));

	gl.useProgram(program);

	// Special state for certain primitives
	if (primType == PRIMITIVETYPE_POINT || primType == PRIMITIVETYPE_WIDE_POINT)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_POINT_SIZE_RANGE);
		const bool		isWidePoint		= primType == PRIMITIVETYPE_WIDE_POINT;
		const float		pointSize		= isWidePoint ? de::min(rnd->getFloat(minPointSize, maxPointSize), range.y()) : 1.0f;
		const int		pointSizeLoc	= gl.getUniformLocation(program, "u_pointSize");

		gl.uniform1f(pointSizeLoc, pointSize);
	}
	else if (primType == PRIMITIVETYPE_WIDE_LINE)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_LINE_WIDTH_RANGE);
		const float		lineWidth		= de::min(rnd->getFloat(minLineWidth, maxLineWidth), range.y());

		gl.lineWidth(lineWidth);
	}

	glu::draw(renderCtx, program, (int)vertexArrays.size(), &vertexArrays[0],
			  glu::PrimitiveList(getGluPrimitiveType(primType), (int)vertices.size()));
}